

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldAppearance.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::MinefieldAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MinefieldAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"MinefieldAppearance:",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"\n\tMinefield Type:           ",0x1c);
  ENUMS::GetEnumAsStringMinefieldType_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_ui16BitUnion).m_ui16App & 3),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tActive Status(0 = true):  ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tActive Lane(0 = true):    ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tState(0 = true):          ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString MinefieldAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "MinefieldAppearance:"
       << "\n\tMinefield Type:           " << GetEnumAsStringMinefieldType( m_ui16BitUnion.m_ui16Type )
       << "\n\tActive Status(0 = true):  " << m_ui16BitUnion.m_ui16ActiveStatus
       << "\n\tActive Lane(0 = true):    " << m_ui16BitUnion.m_ui16Lane
       << "\n\tState(0 = true):          " << m_ui16BitUnion.m_ui16State
       << "\n";

    return ss.str();
}